

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.cpp
# Opt level: O1

ostream * operator<<(ostream *os,strings *s)

{
  string local_78;
  string local_58;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  wire::strings::str(&local_78,s,"\x01\n",&local_38,&local_58);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_78._M_dataplus._M_p,local_78._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return os;
}

Assistant:

std::ostream &operator <<( std::ostream &os, const wire::strings &s )
{
    os << s.str();
    return os;
}